

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

bool __thiscall
Shell::Options::OptionValue<Shell::Options::IntroducedSymbolPrecedence>::checkConstraints
          (OptionValue<Shell::Options::IntroducedSymbolPrecedence> *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  Mode MVar4;
  BadOption BVar5;
  pointer pOVar6;
  UserErrorException *pUVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  RefIterator it;
  
  Lib::
  Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>_>
  ::RefIterator::RefIterator(&it,&this->_constraints);
  do {
    bVar1 = Lib::
            Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>_>
            ::RefIterator::hasNext(&it);
    if (!bVar1) {
      return !bVar1;
    }
    Lib::
    Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>_>
    ::RefIterator::next(&it);
    pOVar6 = std::
             unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>
             ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>
                           *)0x5bd8b7);
    iVar3 = (*pOVar6->_vptr_OptionValueConstraint[2])(pOVar6,this);
  } while ((char)iVar3 != '\0');
  MVar4 = mode(Lib::env);
  if (MVar4 != SPIDER) {
    pOVar6 = std::
             unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>
             ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>
                           *)0x5bd8e7);
    bVar1 = OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>::isHard(pOVar6);
    if (!bVar1) {
      BVar5 = getBadOptionChoice(Lib::env);
      uVar2 = (*(code *)(&DAT_00752208 + *(int *)(&DAT_00752208 + (ulong)BVar5 * 4)))();
      return (bool)uVar2;
    }
    pUVar7 = (UserErrorException *)__cxa_allocate_exception(0x50);
    pOVar6 = std::
             unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>
             ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>
                           *)0x5bda97);
    (*pOVar6->_vptr_OptionValueConstraint[3])(local_100,pOVar6,this);
    std::operator+(&local_80,"\nBroken Constraint: ",local_100);
    Lib::UserErrorException::Exception(pUVar7,&local_80);
    __cxa_throw(pUVar7,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  reportSpiderFail();
  pUVar7 = (UserErrorException *)__cxa_allocate_exception(0x50);
  pOVar6 = std::
           unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>
           ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>
                         *)0x5bda2a);
  (*pOVar6->_vptr_OptionValueConstraint[3])(local_100,pOVar6,this);
  std::operator+(&local_60,"\nBroken Constraint: ",local_100);
  Lib::UserErrorException::Exception(pUVar7,&local_60);
  __cxa_throw(pUVar7,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException
             );
}

Assistant:

bool Options::OptionValue<T>::checkConstraints()
{
  typename Lib::Stack<OptionValueConstraintUP<T>>::RefIterator it(_constraints);
  while (it.hasNext()) {
    const OptionValueConstraintUP<T> &con = it.next();
    if (!con->check(*this)) {

      if (env.options->mode() == Mode::SPIDER) {
      reportSpiderFail();
      USER_ERROR("\nBroken Constraint: " + con->msg(*this));
      }

      if (con->isHard()) {
        USER_ERROR("\nBroken Constraint: " + con->msg(*this));
      }
      switch (env.options->getBadOptionChoice()) {
      case BadOption::HARD:
        USER_ERROR("\nBroken Constraint: " + con->msg(*this));
      case BadOption::SOFT:
        cout << "WARNING Broken Constraint: " + con->msg(*this) << endl;
        return false;
      case BadOption::FORCED:
        if (con->force(this)) {
          cout << "Forced constraint " + con->msg(*this) << endl;
          break;
        }
        else {
          USER_ERROR("\nCould not force Constraint: " + con->msg(*this));
        }
      case BadOption::OFF:
        return false;
      default:
        ASSERTION_VIOLATION;
      }
    }
  }
  return true;
}